

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# masked_variance_intrin_ssse3.c
# Opt level: O1

void bilinear_filter4xh(uint8_t *src,int src_stride,int xoffset,int yoffset,uint8_t *dst,int h)

{
  undefined8 uVar1;
  ulong uVar2;
  long lVar3;
  ulong uVar4;
  long lVar5;
  undefined8 uVar6;
  undefined4 uVar7;
  uint uVar8;
  uint8_t *puVar9;
  long lVar10;
  int val;
  int iVar11;
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 uVar14;
  undefined1 uVar16;
  undefined1 uVar17;
  undefined1 uVar18;
  undefined1 uVar20;
  undefined1 auVar15 [16];
  short sVar21;
  short sVar33;
  short sVar34;
  short sVar35;
  short sVar36;
  short sVar37;
  short sVar38;
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  short sVar39;
  undefined4 uVar48;
  undefined1 auVar40 [16];
  undefined1 auVar47 [16];
  short sVar49;
  short sVar61;
  short sVar62;
  short sVar63;
  short sVar64;
  short sVar65;
  short sVar66;
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  short sVar67;
  undefined1 auVar68 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar88 [16];
  undefined1 uVar19;
  undefined1 auVar25 [16];
  undefined1 auVar22 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar53 [16];
  undefined1 auVar50 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar89 [16];
  undefined1 auVar87 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  
  if (xoffset == 0) {
    if (-1 < h) {
      lVar10 = 0;
      do {
        *(undefined4 *)(dst + lVar10 * 4) = *(undefined4 *)src;
        src = src + src_stride;
        lVar10 = lVar10 + 1;
      } while (h + 1 != (int)lVar10);
    }
  }
  else if (xoffset == 4) {
    if (-1 < h) {
      lVar10 = 0;
      do {
        uVar1 = *(undefined8 *)src;
        uVar16 = (undefined1)((ulong)uVar1 >> 8);
        uVar14 = pavgb(uVar16,(char)uVar1);
        uVar17 = (undefined1)((ulong)uVar1 >> 0x10);
        uVar16 = pavgb(uVar17,uVar16);
        uVar18 = (undefined1)((ulong)uVar1 >> 0x18);
        uVar17 = pavgb(uVar18,uVar17);
        uVar19 = (undefined1)((ulong)uVar1 >> 0x20);
        uVar18 = pavgb(uVar19,uVar18);
        uVar20 = (undefined1)((ulong)uVar1 >> 0x28);
        pavgb(uVar20,uVar19);
        uVar19 = (undefined1)((ulong)uVar1 >> 0x30);
        pavgb(uVar19,uVar20);
        uVar20 = (undefined1)((ulong)uVar1 >> 0x38);
        pavgb(uVar20,uVar19);
        pavgb(0,uVar20);
        pavgb(0,0);
        pavgb(0,0);
        pavgb(0,0);
        pavgb(0,0);
        pavgb(0,0);
        pavgb(0,0);
        pavgb(0,0);
        pavgb(0,0);
        *(uint *)(dst + lVar10 * 4) = CONCAT13(uVar18,CONCAT12(uVar17,CONCAT11(uVar16,uVar14)));
        src = src + src_stride;
        lVar10 = lVar10 + 1;
      } while (h + 1 != (int)lVar10);
    }
  }
  else {
    auVar12 = pshuflw(ZEXT216((ushort)bilinear_filters_2t[xoffset]),
                      ZEXT216((ushort)bilinear_filters_2t[xoffset]),0);
    auVar12._4_4_ = auVar12._0_4_;
    auVar12._8_4_ = auVar12._0_4_;
    auVar12._12_4_ = auVar12._0_4_;
    puVar9 = dst;
    if (0 < h) {
      lVar10 = (long)src_stride;
      iVar11 = 0;
      do {
        uVar2 = *(ulong *)src;
        lVar3 = *(long *)((long)src + lVar10);
        uVar4 = *(ulong *)((long)src + lVar10 * 2);
        lVar5 = *(long *)((long)src + lVar10 * 3);
        auVar76._8_4_ = (int)(uVar2 >> 0x20);
        auVar76._0_8_ = uVar2;
        auVar76._12_4_ = (int)((ulong)lVar3 >> 0x20);
        auVar78._0_8_ = lVar3 << 0x20;
        auVar85._4_8_ = auVar76._8_8_;
        auVar85._0_4_ = (int)lVar3;
        auVar85._12_4_ = 0;
        auVar85 = auVar85 << 0x20;
        auVar87._8_4_ = (int)(uVar4 >> 0x20);
        auVar87._0_8_ = uVar4;
        auVar87._12_4_ = (int)((ulong)lVar5 >> 0x20);
        auVar89._0_8_ = lVar5 << 0x20;
        auVar86._4_8_ = auVar87._8_8_;
        auVar86._0_4_ = (int)lVar5;
        auVar86._12_4_ = 0;
        auVar86 = auVar86 << 0x20;
        auVar46._8_6_ = 0;
        auVar46._0_8_ = uVar2;
        auVar46[0xe] = (char)(uVar2 >> 0x38);
        auVar46[0xf] = (char)((ulong)lVar3 >> 0x38);
        auVar45._14_2_ = auVar46._14_2_;
        auVar45._8_5_ = 0;
        auVar45._0_8_ = uVar2;
        auVar45[0xd] = (char)((ulong)lVar3 >> 0x30);
        auVar44._13_3_ = auVar45._13_3_;
        auVar44._8_4_ = 0;
        auVar44._0_8_ = uVar2;
        auVar44[0xc] = (char)(uVar2 >> 0x30);
        auVar43._12_4_ = auVar44._12_4_;
        auVar43._8_3_ = 0;
        auVar43._0_8_ = uVar2;
        auVar43[0xb] = (char)((ulong)lVar3 >> 0x28);
        auVar42._11_5_ = auVar43._11_5_;
        auVar42._8_2_ = 0;
        auVar42._0_8_ = uVar2;
        auVar42[10] = (char)(uVar2 >> 0x28);
        auVar41._10_6_ = auVar42._10_6_;
        auVar41[8] = 0;
        auVar41._0_8_ = uVar2;
        auVar41[9] = (char)((ulong)lVar3 >> 0x20);
        auVar47._9_7_ = auVar41._9_7_;
        auVar47[8] = (char)(uVar2 >> 0x20);
        auVar47._0_8_ = uVar2;
        auVar40._8_8_ = auVar47._8_8_;
        uVar20 = (undefined1)((ulong)lVar3 >> 0x18);
        auVar40[7] = uVar20;
        uVar17 = (undefined1)(uVar2 >> 0x18);
        auVar40[6] = uVar17;
        uVar19 = (undefined1)((ulong)lVar3 >> 0x10);
        auVar40[5] = uVar19;
        uVar16 = (undefined1)(uVar2 >> 0x10);
        auVar40[4] = uVar16;
        uVar18 = (undefined1)((ulong)lVar3 >> 8);
        auVar40[3] = uVar18;
        uVar14 = (undefined1)(uVar2 >> 8);
        auVar40[2] = uVar14;
        auVar40[0] = (undefined1)uVar2;
        auVar40[1] = (char)lVar3;
        auVar47 = pshufb(auVar40,ZEXT816(0x907050308060402));
        auVar84._0_14_ = auVar85._0_14_;
        auVar84[0xe] = uVar20;
        auVar84[0xf] = auVar47[7];
        auVar83._14_2_ = auVar84._14_2_;
        auVar83._0_13_ = auVar85._0_13_;
        auVar83[0xd] = auVar47[6];
        auVar82._13_3_ = auVar83._13_3_;
        auVar82._0_12_ = auVar85._0_12_;
        auVar82[0xc] = uVar19;
        auVar81._12_4_ = auVar82._12_4_;
        auVar81._0_11_ = auVar85._0_11_;
        auVar81[0xb] = auVar47[5];
        auVar80._11_5_ = auVar81._11_5_;
        auVar80._0_10_ = auVar85._0_10_;
        auVar80[10] = uVar18;
        auVar79._10_6_ = auVar80._10_6_;
        auVar79._0_9_ = auVar85._0_9_;
        auVar79[9] = auVar47[4];
        auVar78._9_7_ = auVar79._9_7_;
        auVar78[8] = (char)lVar3;
        auVar77._8_8_ = auVar78._8_8_;
        auVar77[7] = auVar47[3];
        auVar77[6] = uVar17;
        auVar77[5] = auVar47[2];
        auVar77[4] = uVar16;
        auVar77[3] = auVar47[1];
        auVar77[2] = uVar14;
        auVar77[1] = auVar47[0];
        auVar77[0] = auVar40[0];
        auVar85 = pmaddubsw(auVar77,auVar12);
        sVar21 = pavgw(auVar85._0_2_ >> 6,0);
        sVar33 = pavgw(auVar85._2_2_ >> 6,0);
        sVar34 = pavgw(auVar85._4_2_ >> 6,0);
        sVar35 = pavgw(auVar85._6_2_ >> 6,0);
        sVar36 = pavgw(auVar85._8_2_ >> 6,0);
        sVar37 = pavgw(auVar85._10_2_ >> 6,0);
        sVar38 = pavgw(auVar85._12_2_ >> 6,0);
        sVar39 = pavgw(auVar85._14_2_ >> 6,0);
        auVar75._8_6_ = 0;
        auVar75._0_8_ = uVar4;
        auVar75[0xe] = (char)(uVar4 >> 0x38);
        auVar75[0xf] = (char)((ulong)lVar5 >> 0x38);
        auVar74._14_2_ = auVar75._14_2_;
        auVar74._8_5_ = 0;
        auVar74._0_8_ = uVar4;
        auVar74[0xd] = (char)((ulong)lVar5 >> 0x30);
        auVar73._13_3_ = auVar74._13_3_;
        auVar73._8_4_ = 0;
        auVar73._0_8_ = uVar4;
        auVar73[0xc] = (char)(uVar4 >> 0x30);
        auVar72._12_4_ = auVar73._12_4_;
        auVar72._8_3_ = 0;
        auVar72._0_8_ = uVar4;
        auVar72[0xb] = (char)((ulong)lVar5 >> 0x28);
        auVar71._11_5_ = auVar72._11_5_;
        auVar71._8_2_ = 0;
        auVar71._0_8_ = uVar4;
        auVar71[10] = (char)(uVar4 >> 0x28);
        auVar70._10_6_ = auVar71._10_6_;
        auVar70[8] = 0;
        auVar70._0_8_ = uVar4;
        auVar70[9] = (char)((ulong)lVar5 >> 0x20);
        auVar69._9_7_ = auVar70._9_7_;
        auVar69[8] = (char)(uVar4 >> 0x20);
        auVar69._0_8_ = uVar4;
        auVar68._8_8_ = auVar69._8_8_;
        uVar20 = (undefined1)((ulong)lVar5 >> 0x18);
        auVar68[7] = uVar20;
        uVar17 = (undefined1)(uVar4 >> 0x18);
        auVar68[6] = uVar17;
        uVar19 = (undefined1)((ulong)lVar5 >> 0x10);
        auVar68[5] = uVar19;
        uVar16 = (undefined1)(uVar4 >> 0x10);
        auVar68[4] = uVar16;
        uVar18 = (undefined1)((ulong)lVar5 >> 8);
        auVar68[3] = uVar18;
        uVar14 = (undefined1)(uVar4 >> 8);
        auVar68[2] = uVar14;
        auVar68[0] = (undefined1)uVar4;
        auVar68[1] = (char)lVar5;
        auVar85 = pshufb(auVar68,ZEXT816(0x907050308060402));
        auVar95._0_14_ = auVar86._0_14_;
        auVar95[0xe] = uVar20;
        auVar95[0xf] = auVar85[7];
        auVar94._14_2_ = auVar95._14_2_;
        auVar94._0_13_ = auVar86._0_13_;
        auVar94[0xd] = auVar85[6];
        auVar93._13_3_ = auVar94._13_3_;
        auVar93._0_12_ = auVar86._0_12_;
        auVar93[0xc] = uVar19;
        auVar92._12_4_ = auVar93._12_4_;
        auVar92._0_11_ = auVar86._0_11_;
        auVar92[0xb] = auVar85[5];
        auVar91._11_5_ = auVar92._11_5_;
        auVar91._0_10_ = auVar86._0_10_;
        auVar91[10] = uVar18;
        auVar90._10_6_ = auVar91._10_6_;
        auVar90._0_9_ = auVar86._0_9_;
        auVar90[9] = auVar85[4];
        auVar89._9_7_ = auVar90._9_7_;
        auVar89[8] = (char)lVar5;
        auVar88._8_8_ = auVar89._8_8_;
        auVar88[7] = auVar85[3];
        auVar88[6] = uVar17;
        auVar88[5] = auVar85[2];
        auVar88[4] = uVar16;
        auVar88[3] = auVar85[1];
        auVar88[2] = uVar14;
        auVar88[1] = auVar85[0];
        auVar88[0] = auVar68[0];
        auVar85 = pmaddubsw(auVar88,auVar12);
        sVar49 = pavgw(auVar85._0_2_ >> 6,0);
        sVar61 = pavgw(auVar85._2_2_ >> 6,0);
        sVar62 = pavgw(auVar85._4_2_ >> 6,0);
        sVar63 = pavgw(auVar85._6_2_ >> 6,0);
        sVar64 = pavgw(auVar85._8_2_ >> 6,0);
        sVar65 = pavgw(auVar85._10_2_ >> 6,0);
        sVar66 = pavgw(auVar85._12_2_ >> 6,0);
        sVar67 = pavgw(auVar85._14_2_ >> 6,0);
        *puVar9 = (0 < sVar21) * (sVar21 < 0x100) * (char)sVar21 - (0xff < sVar21);
        puVar9[1] = (0 < sVar33) * (sVar33 < 0x100) * (char)sVar33 - (0xff < sVar33);
        puVar9[2] = (0 < sVar34) * (sVar34 < 0x100) * (char)sVar34 - (0xff < sVar34);
        puVar9[3] = (0 < sVar35) * (sVar35 < 0x100) * (char)sVar35 - (0xff < sVar35);
        puVar9[4] = (0 < sVar36) * (sVar36 < 0x100) * (char)sVar36 - (0xff < sVar36);
        puVar9[5] = (0 < sVar37) * (sVar37 < 0x100) * (char)sVar37 - (0xff < sVar37);
        puVar9[6] = (0 < sVar38) * (sVar38 < 0x100) * (char)sVar38 - (0xff < sVar38);
        puVar9[7] = (0 < sVar39) * (sVar39 < 0x100) * (char)sVar39 - (0xff < sVar39);
        puVar9[8] = (0 < sVar49) * (sVar49 < 0x100) * (char)sVar49 - (0xff < sVar49);
        puVar9[9] = (0 < sVar61) * (sVar61 < 0x100) * (char)sVar61 - (0xff < sVar61);
        puVar9[10] = (0 < sVar62) * (sVar62 < 0x100) * (char)sVar62 - (0xff < sVar62);
        puVar9[0xb] = (0 < sVar63) * (sVar63 < 0x100) * (char)sVar63 - (0xff < sVar63);
        puVar9[0xc] = (0 < sVar64) * (sVar64 < 0x100) * (char)sVar64 - (0xff < sVar64);
        puVar9[0xd] = (0 < sVar65) * (sVar65 < 0x100) * (char)sVar65 - (0xff < sVar65);
        puVar9[0xe] = (0 < sVar66) * (sVar66 < 0x100) * (char)sVar66 - (0xff < sVar66);
        puVar9[0xf] = (0 < sVar67) * (sVar67 < 0x100) * (char)sVar67 - (0xff < sVar67);
        src = (uint8_t *)((long)src + (long)(src_stride << 2));
        puVar9 = puVar9 + 0x10;
        iVar11 = iVar11 + 4;
      } while (iVar11 < h);
    }
    auVar15._8_8_ = 0;
    auVar15._0_8_ = *(ulong *)src;
    auVar85 = pshufb(auVar15,_DAT_0050f7c0);
    auVar12 = pmaddubsw(auVar85,auVar12);
    sVar21 = pavgw(0,auVar12._0_2_ >> 6);
    sVar33 = pavgw(0,auVar12._2_2_ >> 6);
    sVar34 = pavgw(0,auVar12._4_2_ >> 6);
    sVar35 = pavgw(0,auVar12._6_2_ >> 6);
    pavgw(0,auVar12._8_2_ >> 6);
    pavgw(0,auVar12._10_2_ >> 6);
    pavgw(0,auVar12._12_2_ >> 6);
    pavgw(0,auVar12._14_2_ >> 6);
    *(uint *)puVar9 =
         CONCAT13((0 < sVar35) * (sVar35 < 0x100) * (char)sVar35 - (0xff < sVar35),
                  CONCAT12((0 < sVar34) * (sVar34 < 0x100) * (char)sVar34 - (0xff < sVar34),
                           CONCAT11((0 < sVar33) * (sVar33 < 0x100) * (char)sVar33 - (0xff < sVar33)
                                    ,(0 < sVar21) * (sVar21 < 0x100) * (char)sVar21 -
                                     (0xff < sVar21))));
  }
  if (yoffset != 0) {
    if (yoffset == 4) {
      if (0 < h) {
        lVar10 = 0;
        do {
          uVar48 = *(undefined4 *)(dst + lVar10 * 4);
          uVar7 = *(undefined4 *)(dst + lVar10 * 4 + 4);
          uVar14 = pavgb((char)uVar7,(char)uVar48);
          uVar16 = pavgb((char)((uint)uVar7 >> 8),(char)((uint)uVar48 >> 8));
          uVar17 = pavgb((char)((uint)uVar7 >> 0x10),(char)((uint)uVar48 >> 0x10));
          uVar18 = pavgb((char)((uint)uVar7 >> 0x18),(char)((uint)uVar48 >> 0x18));
          pavgb(0,0);
          pavgb(0,0);
          pavgb(0,0);
          pavgb(0,0);
          pavgb(0,0);
          pavgb(0,0);
          pavgb(0,0);
          pavgb(0,0);
          pavgb(0,0);
          pavgb(0,0);
          pavgb(0,0);
          pavgb(0,0);
          *(uint *)(dst + lVar10 * 4) = CONCAT13(uVar18,CONCAT12(uVar17,CONCAT11(uVar16,uVar14)));
          lVar10 = lVar10 + 1;
        } while (h != (int)lVar10);
      }
    }
    else if (0 < h) {
      auVar12 = pshuflw(ZEXT216((ushort)bilinear_filters_2t[yoffset]),
                        ZEXT216((ushort)bilinear_filters_2t[yoffset]),0);
      auVar13._0_4_ = auVar12._0_4_;
      auVar13._4_4_ = auVar13._0_4_;
      auVar13._8_4_ = auVar13._0_4_;
      auVar13._12_4_ = auVar13._0_4_;
      lVar10 = 0;
      do {
        uVar8 = *(uint *)(dst + lVar10 * 4);
        uVar1 = *(undefined8 *)(dst + lVar10 * 4 + 4);
        uVar48 = (undefined4)((ulong)uVar1 >> 0x20);
        auVar51._4_4_ = uVar48;
        auVar51._0_4_ = uVar48;
        uVar6 = *(undefined8 *)(dst + lVar10 * 4 + 0xc);
        auVar23._4_8_ = 0;
        auVar23._0_4_ = uVar8;
        auVar23._12_4_ = uVar48;
        auVar22._8_8_ = auVar23._8_8_;
        auVar22._0_8_ = CONCAT44((int)uVar1,uVar8);
        auVar51._8_4_ = uVar48;
        auVar51._12_4_ = (int)((ulong)uVar6 >> 0x20);
        auVar50._8_8_ = auVar51._8_8_;
        auVar50._0_8_ = CONCAT44((int)uVar6,uVar48);
        uVar20 = (undefined1)((ulong)uVar1 >> 0x38);
        auVar25[7] = (undefined1)((ulong)uVar1 >> 0x18);
        auVar32._0_14_ = auVar22._0_14_;
        auVar32[0xe] = auVar25[7];
        auVar32[0xf] = uVar20;
        auVar31._14_2_ = auVar32._14_2_;
        auVar31._0_13_ = auVar22._0_13_;
        uVar19 = (undefined1)((ulong)uVar1 >> 0x30);
        auVar31[0xd] = uVar19;
        uVar16 = (undefined1)((ulong)uVar1 >> 0x10);
        auVar30._13_3_ = auVar31._13_3_;
        auVar30._0_12_ = auVar22._0_12_;
        auVar30[0xc] = uVar16;
        auVar29._12_4_ = auVar30._12_4_;
        auVar29._0_11_ = auVar22._0_11_;
        uVar18 = (undefined1)((ulong)uVar1 >> 0x28);
        auVar29[0xb] = uVar18;
        uVar14 = (undefined1)((ulong)uVar1 >> 8);
        auVar28._11_5_ = auVar29._11_5_;
        auVar28._0_10_ = auVar22._0_10_;
        auVar28[10] = uVar14;
        auVar27._10_6_ = auVar28._10_6_;
        auVar27._0_9_ = auVar22._0_9_;
        uVar17 = (undefined1)((ulong)uVar1 >> 0x20);
        auVar27[9] = uVar17;
        auVar26._9_7_ = auVar27._9_7_;
        auVar26[8] = (char)uVar1;
        auVar26._0_8_ = auVar22._0_8_;
        auVar25._8_8_ = auVar26._8_8_;
        auVar25[6] = (char)(uVar8 >> 0x18);
        auVar25[5] = uVar16;
        auVar25[4] = (char)(uVar8 >> 0x10);
        auVar25._0_4_ = uVar8;
        auVar24._4_12_ = auVar25._4_12_;
        auVar24[3] = uVar14;
        auVar24[2] = (char)(uVar8 >> 8);
        auVar24[0] = (undefined1)uVar8;
        auVar24[1] = (char)uVar1;
        auVar12 = pmaddubsw(auVar24,auVar13);
        sVar21 = pavgw(auVar12._0_2_ >> 6,0);
        sVar33 = pavgw(auVar12._2_2_ >> 6,0);
        sVar34 = pavgw(auVar12._4_2_ >> 6,0);
        sVar35 = pavgw(auVar12._6_2_ >> 6,0);
        sVar36 = pavgw(auVar12._8_2_ >> 6,0);
        sVar37 = pavgw(auVar12._10_2_ >> 6,0);
        sVar38 = pavgw(auVar12._12_2_ >> 6,0);
        sVar39 = pavgw(auVar12._14_2_ >> 6,0);
        auVar53[7] = (undefined1)((ulong)uVar6 >> 0x18);
        auVar60._0_14_ = auVar50._0_14_;
        auVar60[0xe] = auVar53[7];
        auVar60[0xf] = (char)((ulong)uVar6 >> 0x38);
        auVar59._14_2_ = auVar60._14_2_;
        auVar59._0_13_ = auVar50._0_13_;
        auVar59[0xd] = (char)((ulong)uVar6 >> 0x30);
        uVar16 = (undefined1)((ulong)uVar6 >> 0x10);
        auVar58._13_3_ = auVar59._13_3_;
        auVar58._0_12_ = auVar50._0_12_;
        auVar58[0xc] = uVar16;
        auVar57._12_4_ = auVar58._12_4_;
        auVar57._0_11_ = auVar50._0_11_;
        auVar57[0xb] = (char)((ulong)uVar6 >> 0x28);
        uVar14 = (undefined1)((ulong)uVar6 >> 8);
        auVar56._11_5_ = auVar57._11_5_;
        auVar56._0_10_ = auVar50._0_10_;
        auVar56[10] = uVar14;
        auVar55._10_6_ = auVar56._10_6_;
        auVar55._0_9_ = auVar50._0_9_;
        auVar55[9] = (char)((ulong)uVar6 >> 0x20);
        auVar54._9_7_ = auVar55._9_7_;
        auVar54[8] = (char)uVar6;
        auVar54._0_8_ = auVar50._0_8_;
        auVar53._8_8_ = auVar54._8_8_;
        auVar53[6] = uVar20;
        auVar53[5] = uVar16;
        auVar53[4] = uVar19;
        auVar53._0_4_ = uVar48;
        auVar52._4_12_ = auVar53._4_12_;
        auVar52[3] = uVar14;
        auVar52[2] = uVar18;
        auVar52[1] = (char)uVar6;
        auVar52[0] = uVar17;
        auVar12 = pmaddubsw(auVar52,auVar13);
        sVar49 = pavgw(auVar12._0_2_ >> 6,0);
        sVar61 = pavgw(auVar12._2_2_ >> 6,0);
        sVar62 = pavgw(auVar12._4_2_ >> 6,0);
        sVar63 = pavgw(auVar12._6_2_ >> 6,0);
        sVar64 = pavgw(auVar12._8_2_ >> 6,0);
        sVar65 = pavgw(auVar12._10_2_ >> 6,0);
        sVar66 = pavgw(auVar12._12_2_ >> 6,0);
        sVar67 = pavgw(auVar12._14_2_ >> 6,0);
        puVar9 = dst + lVar10 * 4;
        *puVar9 = (0 < sVar21) * (sVar21 < 0x100) * (char)sVar21 - (0xff < sVar21);
        puVar9[1] = (0 < sVar33) * (sVar33 < 0x100) * (char)sVar33 - (0xff < sVar33);
        puVar9[2] = (0 < sVar34) * (sVar34 < 0x100) * (char)sVar34 - (0xff < sVar34);
        puVar9[3] = (0 < sVar35) * (sVar35 < 0x100) * (char)sVar35 - (0xff < sVar35);
        puVar9[4] = (0 < sVar36) * (sVar36 < 0x100) * (char)sVar36 - (0xff < sVar36);
        puVar9[5] = (0 < sVar37) * (sVar37 < 0x100) * (char)sVar37 - (0xff < sVar37);
        puVar9[6] = (0 < sVar38) * (sVar38 < 0x100) * (char)sVar38 - (0xff < sVar38);
        puVar9[7] = (0 < sVar39) * (sVar39 < 0x100) * (char)sVar39 - (0xff < sVar39);
        puVar9[8] = (0 < sVar49) * (sVar49 < 0x100) * (char)sVar49 - (0xff < sVar49);
        puVar9[9] = (0 < sVar61) * (sVar61 < 0x100) * (char)sVar61 - (0xff < sVar61);
        puVar9[10] = (0 < sVar62) * (sVar62 < 0x100) * (char)sVar62 - (0xff < sVar62);
        puVar9[0xb] = (0 < sVar63) * (sVar63 < 0x100) * (char)sVar63 - (0xff < sVar63);
        puVar9[0xc] = (0 < sVar64) * (sVar64 < 0x100) * (char)sVar64 - (0xff < sVar64);
        puVar9[0xd] = (0 < sVar65) * (sVar65 < 0x100) * (char)sVar65 - (0xff < sVar65);
        puVar9[0xe] = (0 < sVar66) * (sVar66 < 0x100) * (char)sVar66 - (0xff < sVar66);
        puVar9[0xf] = (0 < sVar67) * (sVar67 < 0x100) * (char)sVar67 - (0xff < sVar67);
        lVar10 = lVar10 + 4;
      } while ((int)lVar10 < h);
    }
  }
  return;
}

Assistant:

static void bilinear_filter4xh(const uint8_t *src, int src_stride, int xoffset,
                               int yoffset, uint8_t *dst, int h) {
  int i;
  // Horizontal filter
  if (xoffset == 0) {
    uint8_t *b = dst;
    for (i = 0; i < h + 1; ++i) {
      __m128i x = xx_loadl_32((__m128i *)src);
      xx_storel_32(b, x);
      src += src_stride;
      b += 4;
    }
  } else if (xoffset == 4) {
    uint8_t *b = dst;
    for (i = 0; i < h + 1; ++i) {
      __m128i x = _mm_loadl_epi64((__m128i *)src);
      __m128i z = _mm_srli_si128(x, 1);
      xx_storel_32(b, _mm_avg_epu8(x, z));
      src += src_stride;
      b += 4;
    }
  } else {
    uint8_t *b = dst;
    const uint8_t *hfilter = bilinear_filters_2t[xoffset];
    const __m128i hfilter_vec = _mm_set1_epi16(hfilter[0] | (hfilter[1] << 8));
    for (i = 0; i < h; i += 4) {
      const __m128i x0 = _mm_loadl_epi64((__m128i *)src);
      const __m128i z0 = _mm_srli_si128(x0, 1);
      const __m128i x1 = _mm_loadl_epi64((__m128i *)&src[src_stride]);
      const __m128i z1 = _mm_srli_si128(x1, 1);
      const __m128i x2 = _mm_loadl_epi64((__m128i *)&src[src_stride * 2]);
      const __m128i z2 = _mm_srli_si128(x2, 1);
      const __m128i x3 = _mm_loadl_epi64((__m128i *)&src[src_stride * 3]);
      const __m128i z3 = _mm_srli_si128(x3, 1);

      const __m128i a0 = _mm_unpacklo_epi32(x0, x1);
      const __m128i b0 = _mm_unpacklo_epi32(z0, z1);
      const __m128i a1 = _mm_unpacklo_epi32(x2, x3);
      const __m128i b1 = _mm_unpacklo_epi32(z2, z3);
      const __m128i res = filter_block_2rows(&a0, &b0, &a1, &b1, &hfilter_vec);
      _mm_storeu_si128((__m128i *)b, res);

      src += src_stride * 4;
      b += 16;
    }
    // Handle i = h separately
    const __m128i x = _mm_loadl_epi64((__m128i *)src);
    const __m128i z = _mm_srli_si128(x, 1);

    __m128i v0 = _mm_unpacklo_epi8(x, z);
    v0 = _mm_maddubs_epi16(v0, hfilter_vec);
    v0 = xx_roundn_epu16(v0, FILTER_BITS);

    xx_storel_32(b, _mm_packus_epi16(v0, v0));
  }

  // Vertical filter
  if (yoffset == 0) {
    // The data is already in 'dst', so no need to filter
  } else if (yoffset == 4) {
    for (i = 0; i < h; ++i) {
      __m128i x = xx_loadl_32((__m128i *)dst);
      __m128i y = xx_loadl_32((__m128i *)&dst[4]);
      xx_storel_32(dst, _mm_avg_epu8(x, y));
      dst += 4;
    }
  } else {
    const uint8_t *vfilter = bilinear_filters_2t[yoffset];
    const __m128i vfilter_vec = _mm_set1_epi16(vfilter[0] | (vfilter[1] << 8));
    for (i = 0; i < h; i += 4) {
      const __m128i a = xx_loadl_32((__m128i *)dst);
      const __m128i b = xx_loadl_32((__m128i *)&dst[4]);
      const __m128i c = xx_loadl_32((__m128i *)&dst[8]);
      const __m128i d = xx_loadl_32((__m128i *)&dst[12]);
      const __m128i e = xx_loadl_32((__m128i *)&dst[16]);

      const __m128i a0 = _mm_unpacklo_epi32(a, b);
      const __m128i b0 = _mm_unpacklo_epi32(b, c);
      const __m128i a1 = _mm_unpacklo_epi32(c, d);
      const __m128i b1 = _mm_unpacklo_epi32(d, e);
      const __m128i res = filter_block_2rows(&a0, &b0, &a1, &b1, &vfilter_vec);
      _mm_storeu_si128((__m128i *)dst, res);

      dst += 16;
    }
  }
}